

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

Configuration * __thiscall
el::base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
get<el::Level,el::ConfigurationType>
          (RegistryWithPred<el::Configuration,el::Configuration::Predicate> *this,Level *arg1,
          ConfigurationType arg2)

{
  bool bVar1;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *pvVar2;
  reference ppCVar3;
  bool bVar4;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_50;
  Predicate local_48;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_40;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_38;
  __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_30;
  iterator iter;
  ConfigurationType arg2_local;
  Level *arg1_local;
  RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *this_local;
  
  iter._M_current._4_4_ = arg2;
  pvVar2 = (vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
           (**(code **)(*(long *)this + 0x58))();
  local_38._M_current =
       (Configuration **)
       std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::begin(pvVar2);
  pvVar2 = (vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
           (**(code **)(*(long *)this + 0x58))();
  local_40._M_current =
       (Configuration **)
       std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end(pvVar2);
  Configuration::Predicate::Predicate(&local_48,*arg1,iter._M_current._4_4_);
  local_30 = ::std::
             find_if<__gnu_cxx::__normal_iterator<el::Configuration**,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>,el::Configuration::Predicate>
                       (local_38,local_40,local_48);
  pvVar2 = (vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
           (**(code **)(*(long *)this + 0x58))();
  local_50._M_current =
       (Configuration **)
       std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end(pvVar2);
  bVar1 = __gnu_cxx::operator!=(&local_30,&local_50);
  bVar4 = false;
  if (bVar1) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_30);
    bVar4 = *ppCVar3 != (Configuration *)0x0;
  }
  if (bVar4) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(&local_30);
    this_local = (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *)*ppCVar3;
  }
  else {
    this_local = (RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *)0x0;
  }
  return (Configuration *)this_local;
}

Assistant:

T_Ptr* get(const T& arg1, const T2 arg2) {
    iterator iter = std::find_if(this->list().begin(), this->list().end(), Pred(arg1, arg2));
    if (iter != this->list().end() && *iter != nullptr) {
      return *iter;
    }
    return nullptr;
  }